

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task12.cpp
# Opt level: O2

int main(void)

{
  void *pvVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  int i;
  int iVar5;
  int a;
  
  std::istream::operator>>((istream *)&std::cin,&a);
  uVar4 = (ulong)(uint)a;
  pvVar1 = operator_new__((long)a);
  iVar5 = 2;
  do {
    if ((int)uVar4 <= iVar5) {
LAB_0010125e:
      operator_delete__(pvVar1);
      return 0;
    }
    iVar3 = iVar5 * 2;
    while (iVar3 < (int)uVar4) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar4 = (ulong)a;
      iVar3 = iVar3 + iVar5;
      if (*(char *)((long)pvVar1 + uVar4) == '\x01') {
        std::operator<<((ostream *)&std::cout,anon_var_dwarf_6e1);
        goto LAB_0010125e;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int main(){
    int a;
    bool flag = true;

    cin >> a;

    bool *b = new bool[a];
    for (int i = 2; i < a; i++){
        for (int j = 2*i; j < a; j += i){
            cout << j << endl;
            b[j] == true;
            if (b[a]){
                flag = false;
                cout << "не простое";
                break;
            }
        }
        if (!flag) break;
    }

    delete[] b;
    return 0;
}